

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

MatchFunction * __thiscall
duckdb::RowMatcher::GetMatchFunction<true>
          (MatchFunction *__return_storage_ptr__,RowMatcher *this,LogicalType *type,
          ExpressionType predicate)

{
  PhysicalType PVar1;
  InternalException *this_00;
  allocator local_59;
  string local_58;
  string local_38;
  
  PVar1 = type->physical_type_;
  switch(PVar1) {
  case BOOL:
    GetMatchFunction<true,bool>(__return_storage_ptr__,this,predicate);
    break;
  case UINT8:
    GetMatchFunction<true,unsigned_char>(__return_storage_ptr__,this,predicate);
    break;
  case INT8:
    GetMatchFunction<true,signed_char>(__return_storage_ptr__,this,predicate);
    break;
  case UINT16:
    GetMatchFunction<true,unsigned_short>(__return_storage_ptr__,this,predicate);
    break;
  case INT16:
    GetMatchFunction<true,short>(__return_storage_ptr__,this,predicate);
    break;
  case UINT32:
    GetMatchFunction<true,unsigned_int>(__return_storage_ptr__,this,predicate);
    break;
  case INT32:
    GetMatchFunction<true,int>(__return_storage_ptr__,this,predicate);
    break;
  case UINT64:
    GetMatchFunction<true,unsigned_long>(__return_storage_ptr__,this,predicate);
    break;
  case INT64:
    GetMatchFunction<true,long>(__return_storage_ptr__,this,predicate);
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_0169f40a_caseD_a:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unsupported PhysicalType for RowMatcher::GetMatchFunction: %s",
               &local_59);
    EnumUtil::ToString<duckdb::PhysicalType>(&local_58,type->physical_type_);
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_38,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    GetMatchFunction<true,float>(__return_storage_ptr__,this,predicate);
    break;
  case DOUBLE:
    GetMatchFunction<true,double>(__return_storage_ptr__,this,predicate);
    break;
  case INTERVAL:
    GetMatchFunction<true,duckdb::interval_t>(__return_storage_ptr__,this,predicate);
    break;
  case LIST:
  case ARRAY:
    GetListMatchFunction<true>(__return_storage_ptr__,this,predicate);
    break;
  case STRUCT:
    GetStructMatchFunction<true>(__return_storage_ptr__,this,type,predicate);
    break;
  default:
    if (PVar1 == VARCHAR) {
      GetMatchFunction<true,duckdb::string_t>(__return_storage_ptr__,this,predicate);
    }
    else if (PVar1 == UINT128) {
      GetMatchFunction<true,duckdb::uhugeint_t>(__return_storage_ptr__,this,predicate);
    }
    else {
      if (PVar1 != INT128) goto switchD_0169f40a_caseD_a;
      GetMatchFunction<true,duckdb::hugeint_t>(__return_storage_ptr__,this,predicate);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MatchFunction RowMatcher::GetMatchFunction(const LogicalType &type, const ExpressionType predicate) {
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		return GetMatchFunction<NO_MATCH_SEL, bool>(predicate);
	case PhysicalType::INT8:
		return GetMatchFunction<NO_MATCH_SEL, int8_t>(predicate);
	case PhysicalType::INT16:
		return GetMatchFunction<NO_MATCH_SEL, int16_t>(predicate);
	case PhysicalType::INT32:
		return GetMatchFunction<NO_MATCH_SEL, int32_t>(predicate);
	case PhysicalType::INT64:
		return GetMatchFunction<NO_MATCH_SEL, int64_t>(predicate);
	case PhysicalType::INT128:
		return GetMatchFunction<NO_MATCH_SEL, hugeint_t>(predicate);
	case PhysicalType::UINT8:
		return GetMatchFunction<NO_MATCH_SEL, uint8_t>(predicate);
	case PhysicalType::UINT16:
		return GetMatchFunction<NO_MATCH_SEL, uint16_t>(predicate);
	case PhysicalType::UINT32:
		return GetMatchFunction<NO_MATCH_SEL, uint32_t>(predicate);
	case PhysicalType::UINT64:
		return GetMatchFunction<NO_MATCH_SEL, uint64_t>(predicate);
	case PhysicalType::UINT128:
		return GetMatchFunction<NO_MATCH_SEL, uhugeint_t>(predicate);
	case PhysicalType::FLOAT:
		return GetMatchFunction<NO_MATCH_SEL, float>(predicate);
	case PhysicalType::DOUBLE:
		return GetMatchFunction<NO_MATCH_SEL, double>(predicate);
	case PhysicalType::INTERVAL:
		return GetMatchFunction<NO_MATCH_SEL, interval_t>(predicate);
	case PhysicalType::VARCHAR:
		return GetMatchFunction<NO_MATCH_SEL, string_t>(predicate);
	case PhysicalType::STRUCT:
		return GetStructMatchFunction<NO_MATCH_SEL>(type, predicate);
	case PhysicalType::LIST:
		return GetListMatchFunction<NO_MATCH_SEL>(predicate);
	case PhysicalType::ARRAY:
		// Same logic as for lists
		return GetListMatchFunction<NO_MATCH_SEL>(predicate);
	default:
		throw InternalException("Unsupported PhysicalType for RowMatcher::GetMatchFunction: %s",
		                        EnumUtil::ToString(type.InternalType()));
	}
}